

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_NtkLevel_rec(Abc_Obj_t *pNode)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pNode_00;
  uint uVar3;
  long lVar4;
  
  uVar3 = *(uint *)&pNode->field_0x14;
  switch(uVar3 & 0xf) {
  case 1:
  case 7:
    iVar1 = Abc_NodeIsTravIdCurrent(pNode);
    if (iVar1 == 0) {
      Abc_NodeSetTravIdCurrent(pNode);
      uVar3 = *(uint *)&pNode->field_0x14 & 0xfff;
      *(uint *)&pNode->field_0x14 = uVar3;
      for (lVar4 = 0; iVar1 = (pNode->vFanins).nSize, lVar4 < iVar1; lVar4 = lVar4 + 1) {
        pNode_00 = Abc_ObjFanin0Ntk((Abc_Obj_t *)
                                    pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar4]]);
        uVar2 = Abc_NtkLevel_rec(pNode_00);
        uVar3 = *(uint *)&pNode->field_0x14;
        if (uVar3 >> 0xc < uVar2) {
          uVar3 = uVar3 & 0xfff | uVar2 << 0xc;
          *(uint *)&pNode->field_0x14 = uVar3;
        }
      }
      if ((0 < iVar1) && (iVar1 = Abc_ObjIsBarBuf(pNode), iVar1 == 0)) {
        uVar3 = uVar3 + 0x1000;
        *(uint *)&pNode->field_0x14 = uVar3;
      }
    }
    else {
      uVar3 = *(uint *)&pNode->field_0x14;
    }
switchD_0069e274_caseD_2:
    return uVar3 >> 0xc;
  case 2:
  case 5:
    goto switchD_0069e274_caseD_2;
  default:
    __assert_fail("Abc_ObjIsNode( pNode ) || pNode->Type == ABC_OBJ_CONST1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0x54b,"int Abc_NtkLevel_rec(Abc_Obj_t *)");
  case 6:
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0x547,"int Abc_NtkLevel_rec(Abc_Obj_t *)");
  }
}

Assistant:

int Abc_NtkLevel_rec( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNext;
    int i, Level;
    assert( !Abc_ObjIsNet(pNode) );
    // skip the PI
    if ( Abc_ObjIsCi(pNode) )
        return pNode->Level;
    assert( Abc_ObjIsNode( pNode ) || pNode->Type == ABC_OBJ_CONST1);
    // if this node is already visited, return
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return pNode->Level;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin
    pNode->Level = 0;
    Abc_ObjForEachFanin( pNode, pNext, i )
    {
        Level = Abc_NtkLevel_rec( Abc_ObjFanin0Ntk(pNext) );
        if ( pNode->Level < (unsigned)Level )
            pNode->Level = Level;
    }
    if ( Abc_ObjFaninNum(pNode) > 0 && !Abc_ObjIsBarBuf(pNode) )
        pNode->Level++;
    return pNode->Level;
}